

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Adjuster.cxx
# Opt level: O1

int __thiscall Fl_Adjuster::handle(Fl_Adjuster *this,int event)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  double dVar5;
  Fl_Widget_Tracker wp;
  Fl_Widget_Tracker local_30;
  double local_28;
  
  iVar2 = Fl::e_x;
  iVar3 = 1;
  switch(event) {
  case 1:
    bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (bVar1) {
      Fl::focus((Fl_Widget *)this);
    }
    this->ix = iVar2;
    iVar3 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
    iVar4 = (this->super_Fl_Valuator).super_Fl_Widget.h_;
    if (iVar3 < iVar4) {
      iVar2 = 3 - ((~(this->super_Fl_Valuator).super_Fl_Widget.y_ + Fl::e_y) * 3) / iVar4;
    }
    else {
      iVar2 = ((iVar2 - (this->super_Fl_Valuator).super_Fl_Widget.x_) * 3) / iVar3 + 1;
    }
    *(int *)&(this->super_Fl_Valuator).field_0xa4 = iVar2;
    Fl_Widget_Tracker::Fl_Widget_Tracker(&local_30,(Fl_Widget *)this);
    (this->super_Fl_Valuator).previous_value_ = (this->super_Fl_Valuator).value_;
    Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_30);
    if (local_30.wp_ == (Fl_Widget *)0x0) {
      return 1;
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    return 1;
  case 2:
    if (Fl::e_is_click != 0) {
      iVar2 = -10;
      if ((Fl::e_state._2_1_ & 0xf) == 0) {
        iVar2 = 10;
      }
      iVar3 = *(int *)&(this->super_Fl_Valuator).field_0xa4;
      if (iVar3 != 3) {
        if (iVar3 == 2) {
          iVar2 = iVar2 * 10;
        }
        else {
          iVar2 = iVar2 * 100;
        }
      }
      local_28 = Fl_Valuator::increment
                           (&this->super_Fl_Valuator,(this->super_Fl_Valuator).previous_value_,iVar2
                           );
      Fl_Widget_Tracker::Fl_Widget_Tracker(&local_30,(Fl_Widget *)this);
      if (this->soft_ == 0) {
        dVar5 = Fl_Valuator::clamp(&this->super_Fl_Valuator,local_28);
      }
      else {
        dVar5 = Fl_Valuator::softclamp(&this->super_Fl_Valuator,local_28);
      }
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar5);
      Fl_Widget_Tracker::~Fl_Widget_Tracker(&local_30);
      if (local_30.wp_ == (Fl_Widget *)0x0) {
        return 1;
      }
    }
    *(undefined4 *)&(this->super_Fl_Valuator).field_0xa4 = 0;
    Fl_Widget::redraw((Fl_Widget *)this);
    Fl_Valuator::handle_release(&this->super_Fl_Valuator);
    break;
  case 3:
  case 4:
    goto switchD_001a5197_caseD_3;
  case 5:
    iVar2 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
    iVar3 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
    if (iVar3 < (this->super_Fl_Valuator).super_Fl_Widget.h_) {
      iVar4 = Fl::e_x - iVar2;
      if (iVar2 <= Fl::e_x) {
        iVar4 = Fl::e_x - (iVar2 + iVar3);
        if (iVar4 == 0 || Fl::e_x < iVar2 + iVar3) {
          iVar4 = 0;
        }
      }
    }
    else {
      iVar2 = ((*(int *)&(this->super_Fl_Valuator).field_0xa4 + -1) * iVar3) / 3 + iVar2;
      iVar4 = Fl::e_x - iVar2;
      if (iVar2 <= Fl::e_x) {
        iVar4 = 0;
        if (iVar3 / 3 + iVar2 < Fl::e_x) {
          iVar3 = (int)((ulong)((long)iVar3 * 0x55555555) >> 0x20) - iVar3;
          iVar4 = (((iVar3 >> 1) - (iVar3 >> 0x1f)) + Fl::e_x) - iVar2;
        }
      }
    }
    iVar2 = *(int *)&(this->super_Fl_Valuator).field_0xa4;
    if (iVar2 != 3) {
      if (iVar2 == 2) {
        iVar4 = iVar4 * 10;
      }
      else {
        iVar4 = iVar4 * 100;
      }
    }
    dVar5 = Fl_Valuator::increment
                      (&this->super_Fl_Valuator,(this->super_Fl_Valuator).previous_value_,iVar4);
    if (this->soft_ == 0) goto LAB_001a549b;
    dVar5 = Fl_Valuator::softclamp(&this->super_Fl_Valuator,dVar5);
    goto LAB_001a54a3;
  case 6:
  case 7:
    bVar1 = Fl::option(OPTION_VISIBLE_FOCUS);
    if (!bVar1) {
      return 0;
    }
    Fl_Widget::redraw((Fl_Widget *)this);
    break;
  case 8:
    iVar3 = 0;
    switch(Fl::e_keysym) {
    case 0xff51:
      if ((this->super_Fl_Valuator).super_Fl_Widget.w_ <
          (this->super_Fl_Valuator).super_Fl_Widget.h_) {
        return 0;
      }
      break;
    case 0xff52:
      if ((this->super_Fl_Valuator).super_Fl_Widget.h_ <
          (this->super_Fl_Valuator).super_Fl_Widget.w_) {
        return 0;
      }
      break;
    case 0xff53:
      if ((this->super_Fl_Valuator).super_Fl_Widget.w_ <
          (this->super_Fl_Valuator).super_Fl_Widget.h_) {
        return 0;
      }
      goto LAB_001a5458;
    case 0xff54:
      if ((this->super_Fl_Valuator).super_Fl_Widget.h_ <
          (this->super_Fl_Valuator).super_Fl_Widget.w_) {
        return 0;
      }
LAB_001a5458:
      iVar3 = 1;
      dVar5 = Fl_Valuator::increment(&this->super_Fl_Valuator,(this->super_Fl_Valuator).value_,1);
      dVar5 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar5);
      Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar5);
    default:
      goto switchD_001a5197_caseD_3;
    }
    dVar5 = Fl_Valuator::increment(&this->super_Fl_Valuator,(this->super_Fl_Valuator).value_,-1);
LAB_001a549b:
    dVar5 = Fl_Valuator::clamp(&this->super_Fl_Valuator,dVar5);
LAB_001a54a3:
    Fl_Valuator::handle_drag(&this->super_Fl_Valuator,dVar5);
    break;
  default:
    iVar3 = 0;
    goto switchD_001a5197_caseD_3;
  }
  iVar3 = 1;
switchD_001a5197_caseD_3:
  return iVar3;
}

Assistant:

int Fl_Adjuster::handle(int event) {
  double v;
  int delta;
  int mx = Fl::event_x();
  // Fl_Widget_Tracker wp(this);
  switch (event) {
    case FL_PUSH:
      if (Fl::visible_focus()) Fl::focus(this);
      ix = mx;
      if (w()>=h())
	drag = 3*(mx-x())/w() + 1;
      else
	drag = 3-3*(Fl::event_y()-y()-1)/h();
      { Fl_Widget_Tracker wp(this);
	handle_push();
	if (wp.deleted()) return 1;
      }
      redraw();
      return 1;
    case FL_DRAG:
      if (w() >= h()) {
	delta = x()+(drag-1)*w()/3;	// left edge of button
	if (mx < delta)
	  delta = mx-delta;
	else if (mx > (delta+w()/3)) // right edge of button
	  delta = mx-delta-w()/3;
	else
	  delta = 0;
      } else {
	if (mx < x())
	  delta = mx-x();
	else if (mx > (x()+w()))
	  delta = mx-x()-w();
	else
	  delta = 0;
      }
      switch (drag) {
	case 3: v = increment(previous_value(), delta); break;
	case 2: v = increment(previous_value(), delta*10); break;
	default:v = increment(previous_value(), delta*100); break;
      }
      handle_drag(soft() ? softclamp(v) : clamp(v));
      return 1;
    case FL_RELEASE:
      if (Fl::event_is_click()) { // detect click but no drag
	if (Fl::event_state()&0xF0000) delta = -10;
	else delta = 10;
	switch (drag) {
	  case 3: v = increment(previous_value(), delta); break;
	  case 2: v = increment(previous_value(), delta*10); break;
	  default:v = increment(previous_value(), delta*100); break;
	}
	Fl_Widget_Tracker wp(this);
	handle_drag(soft() ? softclamp(v) : clamp(v));
	if (wp.deleted()) return 1;
      }
      drag = 0;
      redraw();
      handle_release();
      return 1;
    case FL_KEYBOARD :
      switch (Fl::event_key()) {
	case FL_Up:
          if (w() > h()) return 0;
	  handle_drag(clamp(increment(value(),-1)));
	  return 1;
	case FL_Down:
          if (w() > h()) return 0;
	  handle_drag(clamp(increment(value(),1)));
	  return 1;
	case FL_Left:
          if (w() < h()) return 0;
	  handle_drag(clamp(increment(value(),-1)));
	  return 1;
	case FL_Right:
          if (w() < h()) return 0;
	  handle_drag(clamp(increment(value(),1)));
	  return 1;
	default:
          return 0;
      }
      // break not required because of switch...

    case FL_FOCUS:
    case FL_UNFOCUS:
      if (Fl::visible_focus()) {
        redraw();
        return 1;
      } else return 0;

    case FL_ENTER :
    case FL_LEAVE :
      return 1;
  }
  return 0;
}